

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceReleaseQueue.hpp
# Opt level: O2

void __thiscall
Diligent::ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper>::
DiscardResource<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,void>
          (ResourceReleaseQueue<Diligent::DynamicStaleResourceWrapper> *this,
          RecycledSyncObject<VulkanUtilities::VkSemaphoreType> *Resource,Uint64 FenceValue)

{
  DynamicStaleResourceWrapper local_20;
  
  DynamicStaleResourceWrapper::
  Create<VulkanUtilities::VulkanSyncObjectManager::RecycledSyncObject<VulkanUtilities::VkSemaphoreType>,void>
            (&local_20,Resource,1);
  DiscardResource(this,&local_20,FenceValue);
  DynamicStaleResourceWrapper::~DynamicStaleResourceWrapper(&local_20);
  return;
}

Assistant:

void DiscardResource(ResourceType&& Resource, Uint64 FenceValue)
    {
        DiscardResource(CreateWrapper(std::move(Resource), 1), FenceValue);
    }